

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

char * __thiscall
ImFont::CalcWordWrapPositionA(ImFont *this,float scale,char *text,char *text_end,float wrap_width)

{
  int iVar1;
  char *pcVar2;
  char *in_text;
  char *pcVar3;
  char *pcVar4;
  float *pfVar5;
  bool bVar6;
  float fVar7;
  uint c;
  uint local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  char *local_40;
  float *local_38;
  
  in_text = text;
  if (text < text_end) {
    fVar7 = wrap_width / scale;
    local_38 = &this->FallbackAdvanceX;
    local_4c = 0.0;
    bVar6 = true;
    local_40 = (char *)0x0;
    local_44 = 0.0;
    local_48 = 0.0;
    pcVar4 = text;
    local_50 = fVar7;
    do {
      local_54 = (uint)*in_text;
      if (*in_text < '\0') {
        iVar1 = ImTextCharFromUtf8(&local_54,in_text,text_end);
        pcVar2 = in_text + iVar1;
        fVar7 = local_50;
      }
      else {
        pcVar2 = in_text + 1;
      }
      if (local_54 == 0) break;
      if (local_54 < 0x20) {
        if (local_54 == 10) {
          bVar6 = true;
          local_48 = 0.0;
          local_44 = 0.0;
          local_4c = 0.0;
        }
        else if (local_54 != 0xd) goto LAB_0020b84c;
      }
      else {
LAB_0020b84c:
        pfVar5 = (this->IndexAdvanceX).Data + local_54;
        if ((this->IndexAdvanceX).Size <= (int)local_54) {
          pfVar5 = local_38;
        }
        if (((local_54 == 9) || (local_54 == 0x3000)) || (local_54 == 0x20)) {
          if (bVar6) {
            local_48 = local_48 + local_4c;
          }
          pcVar3 = pcVar4;
          if (bVar6) {
            pcVar3 = in_text;
            local_4c = 0.0;
          }
          local_4c = local_4c + *pfVar5;
          bVar6 = false;
        }
        else {
          local_44 = local_44 + *pfVar5;
          pcVar3 = pcVar2;
          if (!bVar6) {
            local_48 = local_48 + local_4c + local_44;
            local_44 = 0.0;
            local_4c = 0.0;
            pcVar3 = pcVar4;
            local_40 = pcVar4;
          }
          if ((local_54 < 0x40) && ((0x8800500200000000U >> ((ulong)local_54 & 0x3f) & 1) != 0)) {
            bVar6 = false;
          }
          else {
            bVar6 = local_54 != 0x22;
          }
        }
        pcVar4 = pcVar3;
        if (fVar7 < local_48 + local_44) {
          if (local_40 != (char *)0x0) {
            pcVar3 = local_40;
          }
          if (local_44 < fVar7) {
            in_text = pcVar3;
          }
          break;
        }
      }
      in_text = pcVar2;
    } while (pcVar2 < text_end);
  }
  return in_text + (in_text == text && text < text_end);
}

Assistant:

const char* ImFont::CalcWordWrapPositionA(float scale, const char* text, const char* text_end, float wrap_width) const
{
    // For references, possible wrap point marked with ^
    //  "aaa bbb, ccc,ddd. eee   fff. ggg!"
    //      ^    ^    ^   ^   ^__    ^    ^

    // List of hardcoded separators: .,;!?'"

    // Skip extra blanks after a line returns (that includes not counting them in width computation)
    // e.g. "Hello    world" --> "Hello" "World"

    // Cut words that cannot possibly fit within one line.
    // e.g.: "The tropical fish" with ~5 characters worth of width --> "The tr" "opical" "fish"
    float line_width = 0.0f;
    float word_width = 0.0f;
    float blank_width = 0.0f;
    wrap_width /= scale; // We work with unscaled widths to avoid scaling every characters

    const char* word_end = text;
    const char* prev_word_end = NULL;
    bool inside_word = true;

    const char* s = text;
    while (s < text_end)
    {
        unsigned int c = (unsigned int)*s;
        const char* next_s;
        if (c < 0x80)
            next_s = s + 1;
        else
            next_s = s + ImTextCharFromUtf8(&c, s, text_end);
        if (c == 0)
            break;

        if (c < 32)
        {
            if (c == '\n')
            {
                line_width = word_width = blank_width = 0.0f;
                inside_word = true;
                s = next_s;
                continue;
            }
            if (c == '\r')
            {
                s = next_s;
                continue;
            }
        }

        const float char_width = ((int)c < IndexAdvanceX.Size ? IndexAdvanceX.Data[c] : FallbackAdvanceX);
        if (ImCharIsBlankW(c))
        {
            if (inside_word)
            {
                line_width += blank_width;
                blank_width = 0.0f;
                word_end = s;
            }
            blank_width += char_width;
            inside_word = false;
        }
        else
        {
            word_width += char_width;
            if (inside_word)
            {
                word_end = next_s;
            }
            else
            {
                prev_word_end = word_end;
                line_width += word_width + blank_width;
                word_width = blank_width = 0.0f;
            }

            // Allow wrapping after punctuation.
            inside_word = (c != '.' && c != ',' && c != ';' && c != '!' && c != '?' && c != '\"');
        }

        // We ignore blank width at the end of the line (they can be skipped)
        if (line_width + word_width > wrap_width)
        {
            // Words that cannot possibly fit within an entire line will be cut anywhere.
            if (word_width < wrap_width)
                s = prev_word_end ? prev_word_end : word_end;
            break;
        }

        s = next_s;
    }

    // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
    // +1 may not be a character start point in UTF-8 but it's ok because caller loops use (text >= word_wrap_eol).
    if (s == text && text < text_end)
        return s + 1;
    return s;
}